

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O0

int http_ReadHttpResponse(void *Handle,char *buf,size_t *size,int timeout)

{
  int iVar1;
  parse_status_t pVar2;
  bool bVar3;
  char local_848 [4];
  int ret_code;
  char tempbuf [2048];
  int ok_on_close;
  int num_read;
  parse_status_t status;
  http_connection_handle_t *handle;
  size_t *psStack_28;
  int timeout_local;
  size_t *size_local;
  char *buf_local;
  void *Handle_local;
  
  tempbuf[0x7fc] = '\0';
  tempbuf[0x7fd] = '\0';
  tempbuf[0x7fe] = '\0';
  tempbuf[0x7ff] = '\0';
  if (((Handle == (void *)0x0) || (size == (size_t *)0x0)) || ((*size != 0 && (buf == (char *)0x0)))
     ) {
    if (size != (size_t *)0x0) {
      *size = 0;
    }
    Handle_local._4_4_ = -0x65;
  }
  else {
    handle._4_4_ = timeout;
    psStack_28 = size;
    size_local = (size_t *)buf;
    buf_local = (char *)Handle;
    if (*(int *)((long)Handle + 0x248) == 4) {
      ok_on_close = 0;
    }
    else {
      ok_on_close = parser_parse_entity((http_parser_t *)((long)Handle + 0x90));
    }
    if (ok_on_close == 2) {
      tempbuf[0x7fc] = '\x01';
      tempbuf[0x7fd] = '\0';
      tempbuf[0x7fe] = '\0';
      tempbuf[0x7ff] = '\0';
    }
    else if (((ok_on_close != 0) && (ok_on_close != 6)) && (ok_on_close != 1)) {
      *psStack_28 = 0;
      return -0x71;
    }
    do {
      while( true ) {
        while( true ) {
          bVar3 = false;
          if ((*(ulong *)((long)Handle + 0x210) < *(long *)((long)Handle + 400) + *psStack_28) &&
             (bVar3 = false, *(int *)((long)Handle + 0x284) == 0)) {
            bVar3 = *(int *)((long)Handle + 0x248) != 4;
          }
          if (!bVar3) {
            if (*(int *)((long)Handle + 0x284) != 0) {
              return -0xd2;
            }
            if (*(ulong *)((long)Handle + 0x210) < *(long *)((long)Handle + 400) + *psStack_28) {
              *psStack_28 = *(long *)((long)Handle + 0x210) - *(long *)((long)Handle + 400);
            }
            if (*psStack_28 != 0) {
              memcpy(size_local,
                     (void *)(*(long *)((long)Handle + 0x218) + *(long *)((long)Handle + 0x260)),
                     *psStack_28);
              membuffer_delete((membuffer *)((long)Handle + 0x218),*(size_t *)((long)Handle + 0x260)
                               ,*psStack_28);
              *(size_t *)((long)Handle + 0x270) = *(long *)((long)Handle + 0x270) - *psStack_28;
              *(size_t *)((long)Handle + 400) = *psStack_28 + *(long *)((long)Handle + 400);
            }
            return 0;
          }
          iVar1 = sock_read((SOCKINFO *)Handle,local_848,0x800,(int *)((long)&handle + 4));
          if (0 < iVar1) break;
          if (iVar1 != 0) {
            *psStack_28 = 0;
            return iVar1;
          }
          if (tempbuf._2044_4_ == 0) {
            *psStack_28 = 0;
            *(undefined4 *)((long)Handle + 0x240) = 400;
            return -0x77;
          }
          UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x612,
                     "<<< (RECVD) <<<\n%s\n-----------------\n",
                     *(undefined8 *)((long)Handle + 0x218));
          *(undefined4 *)((long)Handle + 0x248) = 4;
        }
        iVar1 = membuffer_append((membuffer *)((long)Handle + 0x218),local_848,(long)iVar1);
        if (iVar1 != 0) {
          *(undefined4 *)((long)Handle + 0x240) = 500;
          *psStack_28 = 0;
          return 3;
        }
        pVar2 = parser_parse_entity((http_parser_t *)((long)Handle + 0x90));
        if (pVar2 != PARSE_INCOMPLETE_ENTITY) break;
        tempbuf[0x7fc] = '\x01';
        tempbuf[0x7fd] = '\0';
        tempbuf[0x7fe] = '\0';
        tempbuf[0x7ff] = '\0';
      }
    } while (((pVar2 == PARSE_SUCCESS) || (pVar2 == PARSE_CONTINUE_1)) ||
            (pVar2 == PARSE_INCOMPLETE));
    *psStack_28 = 0;
    Handle_local._4_4_ = -0x71;
  }
  return Handle_local._4_4_;
}

Assistant:

int http_ReadHttpResponse(void *Handle, char *buf, size_t *size, int timeout)
{
	http_connection_handle_t *handle = Handle;
	parse_status_t status;
	int num_read;
	int ok_on_close = 0;
	char tempbuf[2 * 1024];
	int ret_code = 0;

	if (!handle || !size || (*size > 0 && !buf)) {
		if (size)
			*size = 0;
		return UPNP_E_INVALID_PARAM;
	}
	/* first parse what has already been gotten */
	if (handle->response.position != POS_COMPLETE)
		status = parser_parse_entity(&handle->response);
	else
		status = PARSE_SUCCESS;
	if (status == PARSE_INCOMPLETE_ENTITY)
		/* read until close */
		ok_on_close = 1;
	else if ((status != PARSE_SUCCESS) && (status != PARSE_CONTINUE_1) &&
		 (status != PARSE_INCOMPLETE)) {
		/*error */
		*size = 0;
		return UPNP_E_BAD_RESPONSE;
	}
	/* read more if necessary entity */
	while (handle->response.msg.amount_discarded + *size >
			handle->response.msg.entity.length &&
		!handle->cancel && handle->response.position != POS_COMPLETE) {
		num_read = sock_read(
			&handle->sock_info, tempbuf, sizeof(tempbuf), &timeout);
		if (num_read > 0) {
			/* append data to buffer */
			ret_code = membuffer_append(&handle->response.msg.msg,
				tempbuf,
				(size_t)num_read);
			if (ret_code != 0) {
				/* set failure status */
				handle->response.http_error_code =
					HTTP_INTERNAL_SERVER_ERROR;
				*size = 0;
				return PARSE_FAILURE;
			}
			status = parser_parse_entity(&handle->response);
			if (status == PARSE_INCOMPLETE_ENTITY) {
				/* read until close */
				ok_on_close = 1;
			} else if ((status != PARSE_SUCCESS) &&
				   (status != PARSE_CONTINUE_1) &&
				   (status != PARSE_INCOMPLETE)) {
				/*error */
				*size = 0;
				return UPNP_E_BAD_RESPONSE;
			}
		} else if (num_read == 0) {
			if (ok_on_close) {
				UpnpPrintf(UPNP_INFO,
					HTTP,
					__FILE__,
					__LINE__,
					"<<< (RECVD) "
					"<<<\n%s\n-----------------\n",
					handle->response.msg.msg.buf);
				handle->response.position = POS_COMPLETE;
			} else {
				/* partial msg */
				*size = 0;
				handle->response.http_error_code =
					HTTP_BAD_REQUEST; /* or response */
				return UPNP_E_BAD_HTTPMSG;
			}
		} else {
			*size = 0;
			return num_read;
		}
	}
	if (handle->cancel) {
		return UPNP_E_CANCELED;
	}
	/* truncate size to fall within available data */
	if (handle->response.msg.amount_discarded + *size >
		handle->response.msg.entity.length)
		*size = handle->response.msg.entity.length -
			handle->response.msg.amount_discarded;
	/* copy data to user buffer. delete copied data */
	if (*size > 0) {
		memcpy(buf,
			&handle->response.msg.msg
				.buf[handle->response.entity_start_position],
			*size);
		membuffer_delete(&handle->response.msg.msg,
			handle->response.entity_start_position,
			*size);
		/* update scanner position. needed for chunked transfers */
		handle->response.scanner.cursor -= *size;
		/* update amount discarded */
		handle->response.msg.amount_discarded += *size;
	}

	return UPNP_E_SUCCESS;
}